

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

ResolveResult * __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::asResolveResult
          (ResolveResult *__return_storage_ptr__,BrandedDecl *this,uint64_t scopeId,
          Builder brandBuilder)

{
  byte bVar1;
  uint uVar2;
  BrandedDecl *pBVar3;
  ErrorReporter *errorReporter;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Builder target;
  BrandScope **ppBVar10;
  RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *ppBVar11;
  BrandScope **ppBVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  BrandScope *pBVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  Vector<capnp::compiler::NodeTranslator::BrandScope_*> levels;
  Builder scope;
  Builder bindings;
  Builder scopes;
  Vector<capnp::compiler::NodeTranslator::BrandScope_*> local_158;
  ResolveResult *local_138;
  ulong local_130;
  ulong local_128;
  BrandScope *local_120;
  StructBuilder local_118;
  StructBuilder local_f0;
  undefined8 uStack_c8;
  PointerBuilder local_c0;
  StructBuilder local_a8;
  ListBuilder local_80;
  ListBuilder local_58;
  
  uVar2 = (this->body).tag;
  __return_storage_ptr__->tag = uVar2;
  if (uVar2 == 1) {
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) =
         *(undefined8 *)((long)&(this->body).field_1 + 0x20);
    pvVar4 = (this->body).field_1.forceAligned;
    uVar5 = *(undefined8 *)((long)&(this->body).field_1 + 8);
    uVar6 = *(undefined8 *)((long)&(this->body).field_1 + 0x18);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) =
         *(undefined8 *)((long)&(this->body).field_1 + 0x10);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x18) = uVar6;
    (__return_storage_ptr__->field_1).forceAligned = pvVar4;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = uVar5;
    bVar1 = (this->body).field_1.space[0x28];
    (__return_storage_ptr__->field_1).space[0x28] = bVar1;
    if (bVar1 == '\x01') {
      uVar5 = *(undefined8 *)((long)&(this->body).field_1 + 0x30);
      uVar6 = *(undefined8 *)((long)&(this->body).field_1 + 0x38);
      uVar7 = *(undefined8 *)((long)&(this->body).field_1 + 0x40);
      uVar8 = *(undefined8 *)((long)&(this->body).field_1 + 0x48);
      uVar9 = *(undefined8 *)((long)&(this->body).field_1 + 0x58);
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x50) =
           *(undefined8 *)((long)&(this->body).field_1 + 0x50);
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x58) = uVar9;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x40) = uVar7;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x48) = uVar8;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar5;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x38) = uVar6;
    }
  }
  if (uVar2 == 2) {
    uVar5 = *(undefined8 *)((long)&(this->body).field_1 + 8);
    (__return_storage_ptr__->field_1).forceAligned = (this->body).field_1.forceAligned;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = uVar5;
  }
  if (uVar2 == 1) {
    *(uint64_t *)((long)&__return_storage_ptr__->field_1 + 0x10) = scopeId;
    pBVar16 = (this->brand).ptr;
    local_158.builder.ptr = (BrandScope **)0x0;
    local_158.builder.pos = (BrandScope **)0x0;
    local_158.builder.endPtr = (BrandScope **)0x0;
    local_138 = __return_storage_ptr__;
    local_120 = pBVar16;
    do {
      if (((pBVar16->params).size_ != 0) ||
         ((pBVar16->inherited == true && (pBVar16->leafParamCount != 0)))) {
        if (local_158.builder.pos == local_158.builder.endPtr) {
          sVar15 = (long)local_158.builder.endPtr - (long)local_158.builder.ptr >> 2;
          if (local_158.builder.endPtr == local_158.builder.ptr) {
            sVar15 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::setCapacity(&local_158,sVar15);
        }
        *local_158.builder.pos = pBVar16;
        local_158.builder.pos = local_158.builder.pos + 1;
      }
      pBVar16 = (pBVar16->parent).ptr.ptr;
    } while (pBVar16 != (BrandScope *)0x0);
    if (local_158.builder.pos != local_158.builder.ptr) {
      capnp::_::StructBuilder::asReader(&brandBuilder._builder);
      if ((__return_storage_ptr__->field_1).space[0x28] == '\x01') {
        (__return_storage_ptr__->field_1).space[0x28] = '\0';
      }
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x50) = local_f0._32_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x58) = uStack_c8;
      *(void **)((long)&__return_storage_ptr__->field_1 + 0x40) = local_f0.data;
      *(WirePointer **)((long)&__return_storage_ptr__->field_1 + 0x48) = local_f0.pointers;
      *(SegmentBuilder **)((long)&__return_storage_ptr__->field_1 + 0x30) = local_f0.segment;
      *(CapTableBuilder **)((long)&__return_storage_ptr__->field_1 + 0x38) = local_f0.capTable;
      (__return_storage_ptr__->field_1).space[0x28] = '\x01';
      local_f0.segment = brandBuilder._builder.segment;
      local_f0.capTable = brandBuilder._builder.capTable;
      local_f0.data = brandBuilder._builder.pointers;
      capnp::_::PointerBuilder::initStructList
                (&local_58,(PointerBuilder *)&local_f0,
                 (ElementCount)
                 ((ulong)((long)local_158.builder.pos - (long)local_158.builder.ptr) >> 3),
                 (StructSize)0x10002);
      if ((long)local_158.builder.pos - (long)local_158.builder.ptr != 0) {
        uVar13 = (long)local_158.builder.pos - (long)local_158.builder.ptr >> 3;
        uVar20 = 0;
        local_130 = uVar13;
        do {
          capnp::_::ListBuilder::getStructElement(&local_f0,&local_58,(ElementCount)uVar20);
          uVar14 = uVar20 & 0xffffffff;
          pBVar16 = local_158.builder.ptr[uVar14];
          *(uint64_t *)local_f0.data = pBVar16->leafId;
          if (pBVar16->inherited == true) {
            *(undefined2 *)&(((WirePointer *)((long)local_f0.data + 8))->offsetAndKind).value = 1;
          }
          else {
            sVar15 = (local_158.builder.ptr[uVar14]->params).size_;
            *(undefined2 *)&(((WirePointer *)((long)local_f0.data + 8))->offsetAndKind).value = 0;
            local_118.segment = local_f0.segment;
            local_118.capTable = local_f0.capTable;
            local_118.data = local_f0.pointers;
            local_128 = uVar20;
            capnp::_::PointerBuilder::initStructList
                      (&local_80,(PointerBuilder *)&local_118,(ElementCount)sVar15,
                       (StructSize)0x10001);
            uVar18 = (ulong)local_80.elementCount;
            uVar13 = local_130;
            __return_storage_ptr__ = local_138;
            uVar20 = local_128;
            if (uVar18 != 0) {
              lVar19 = 0;
              uVar17 = 0;
              do {
                pBVar3 = (local_158.builder.ptr[uVar14]->params).ptr;
                errorReporter = local_120->errorReporter;
                capnp::_::ListBuilder::getStructElement(&local_118,&local_80,(ElementCount)uVar17);
                *(undefined2 *)&((WireValue<uint32_t> *)local_118.data)->value = 1;
                local_c0.segment = local_118.segment;
                local_c0.capTable = local_118.capTable;
                local_c0.pointer = local_118.pointers;
                capnp::_::PointerBuilder::initStruct(&local_a8,&local_c0,(StructSize)0x10003);
                target._builder.capTable = local_a8.capTable;
                target._builder.segment = local_a8.segment;
                target._builder.data = local_a8.data;
                target._builder.pointers = local_a8.pointers;
                target._builder.dataSize = local_a8.dataSize;
                target._builder.pointerCount = local_a8.pointerCount;
                target._builder._38_2_ = local_a8._38_2_;
                compileAsType((BrandedDecl *)((long)&(pBVar3->body).tag + lVar19),errorReporter,
                              target);
                uVar17 = uVar17 + 1;
                lVar19 = lVar19 + 0xa8;
                uVar13 = local_130;
                __return_storage_ptr__ = local_138;
                uVar20 = local_128;
              } while (uVar18 != uVar17);
            }
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar13);
      }
    }
    ppBVar12 = local_158.builder.endPtr;
    ppBVar11 = local_158.builder.pos;
    ppBVar10 = local_158.builder.ptr;
    if (local_158.builder.ptr != (BrandScope **)0x0) {
      local_158.builder.ptr = (BrandScope **)0x0;
      local_158.builder.pos = (RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *)0x0;
      local_158.builder.endPtr = (BrandScope **)0x0;
      (**(local_158.builder.disposer)->_vptr_ArrayDisposer)
                (local_158.builder.disposer,ppBVar10,8,(long)ppBVar11 - (long)ppBVar10 >> 3,
                 (long)ppBVar12 - (long)ppBVar10 >> 3,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NodeTranslator::Resolver::ResolveResult NodeTranslator::BrandedDecl::asResolveResult(
    uint64_t scopeId, schema::Brand::Builder brandBuilder) {
  auto result = body;
  if (result.is<Resolver::ResolvedDecl>()) {
    // May need to compile our context as the "brand".

    result.get<Resolver::ResolvedDecl>().scopeId = scopeId;

    getIdAndFillBrand([&]() {
      result.get<Resolver::ResolvedDecl>().brand = brandBuilder.asReader();
      return brandBuilder;
    });
  }
  return result;
}